

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

void chacha_test_compact_array(uint8_t *dst,uint8_t *src,size_t srclen)

{
  long lVar1;
  long lVar2;
  
  dst[0x30] = '\0';
  dst[0x31] = '\0';
  dst[0x32] = '\0';
  dst[0x33] = '\0';
  dst[0x34] = '\0';
  dst[0x35] = '\0';
  dst[0x36] = '\0';
  dst[0x37] = '\0';
  dst[0x38] = '\0';
  dst[0x39] = '\0';
  dst[0x3a] = '\0';
  dst[0x3b] = '\0';
  dst[0x3c] = '\0';
  dst[0x3d] = '\0';
  dst[0x3e] = '\0';
  dst[0x3f] = '\0';
  dst[0x20] = '\0';
  dst[0x21] = '\0';
  dst[0x22] = '\0';
  dst[0x23] = '\0';
  dst[0x24] = '\0';
  dst[0x25] = '\0';
  dst[0x26] = '\0';
  dst[0x27] = '\0';
  dst[0x28] = '\0';
  dst[0x29] = '\0';
  dst[0x2a] = '\0';
  dst[0x2b] = '\0';
  dst[0x2c] = '\0';
  dst[0x2d] = '\0';
  dst[0x2e] = '\0';
  dst[0x2f] = '\0';
  dst[0x10] = '\0';
  dst[0x11] = '\0';
  dst[0x12] = '\0';
  dst[0x13] = '\0';
  dst[0x14] = '\0';
  dst[0x15] = '\0';
  dst[0x16] = '\0';
  dst[0x17] = '\0';
  dst[0x18] = '\0';
  dst[0x19] = '\0';
  dst[0x1a] = '\0';
  dst[0x1b] = '\0';
  dst[0x1c] = '\0';
  dst[0x1d] = '\0';
  dst[0x1e] = '\0';
  dst[0x1f] = '\0';
  dst[0] = '\0';
  dst[1] = '\0';
  dst[2] = '\0';
  dst[3] = '\0';
  dst[4] = '\0';
  dst[5] = '\0';
  dst[6] = '\0';
  dst[7] = '\0';
  dst[8] = '\0';
  dst[9] = '\0';
  dst[10] = '\0';
  dst[0xb] = '\0';
  dst[0xc] = '\0';
  dst[0xd] = '\0';
  dst[0xe] = '\0';
  dst[0xf] = '\0';
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      dst[lVar2] = dst[lVar2] ^ src[lVar2];
    }
    src = src + 0x40;
  }
  return;
}

Assistant:

static void
chacha_test_compact_array(uint8_t *dst, const uint8_t *src, size_t srclen) {
    size_t blocks = srclen / CHACHA_BLOCKBYTES;
    size_t i, j;
    memset(dst, 0, CHACHA_BLOCKBYTES);
    for (i = 0; i < blocks; i++) {
        for (j = 0; j < CHACHA_BLOCKBYTES; j++)
            dst[j] ^= src[(i * CHACHA_BLOCKBYTES) + j];
    }
}